

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolb.c
# Opt level: O2

int ffi1fi2(uchar *input,long ntodo,double scale,double zero,short *output,int *status)

{
  long lVar1;
  long lVar2;
  short sVar3;
  double dVar4;
  
  lVar1 = 0;
  if (0 < ntodo) {
    lVar1 = ntodo;
  }
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      dVar4 = ((double)input[lVar2] - zero) / scale;
      if (-32768.49 <= dVar4) {
        if (dVar4 <= 32767.49) {
          if (0.0 <= dVar4) {
            dVar4 = dVar4 + 0.5;
          }
          else {
            dVar4 = dVar4 + -0.5;
          }
          sVar3 = (short)(int)dVar4;
        }
        else {
          *status = -0xb;
          sVar3 = 0x7fff;
        }
      }
      else {
        *status = -0xb;
        sVar3 = -0x8000;
      }
      output[lVar2] = sVar3;
    }
  }
  else {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      output[lVar2] = (ushort)input[lVar2];
    }
  }
  return *status;
}

Assistant:

int ffi1fi2(unsigned char *input,  /* I - array of values to be converted  */
            long ntodo,            /* I - number of elements in the array  */
            double scale,          /* I - FITS TSCALn or BSCALE value      */
            double zero,           /* I - FITS TZEROn or BZERO  value      */
            short *output,         /* O - output array of converted values */
            int *status)           /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = input[ii];   /* just copy input to output */
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (((double) input[ii]) - zero) / scale;

            if (dvalue < DSHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MIN;
            }
            else if (dvalue > DSHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (short) (dvalue + .5);
                else
                    output[ii] = (short) (dvalue - .5);
            }
        }
    }
    return(*status);
}